

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
pbrt::FormattingParserTarget::Camera
          (FormattingParserTarget *this,string *name,ParsedParameterVector *params,FileLoc loc)

{
  undefined1 uVar1;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDI;
  ParameterDictionary dict;
  char *in_stack_fffffffffffffe58;
  string *name_00;
  undefined6 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe66;
  undefined1 in_stack_fffffffffffffe67;
  string local_180 [4];
  int in_stack_fffffffffffffe84;
  FormattingParserTarget *in_stack_fffffffffffffe88;
  RGBColorSpace *in_stack_fffffffffffffe90;
  ParsedParameterVector *in_stack_fffffffffffffe98;
  ParameterDictionary *in_stack_fffffffffffffea0;
  string local_158 [32];
  string local_138 [12];
  int in_stack_fffffffffffffed4;
  ParameterDictionary *in_stack_fffffffffffffed8;
  string local_118 [280];
  
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(in_RDI,in_RDX);
  ParameterDictionary::ParameterDictionary
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                    *)CONCAT17(in_stack_fffffffffffffe67,
                               CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)));
  if (((undefined1  [64])((undefined1  [64])in_RDI->field_2 & (undefined1  [64])0x100) ==
       (undefined1  [64])0x0) ||
     (in_stack_fffffffffffffe67 =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffe67,
                                    CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)),
                           in_stack_fffffffffffffe58), !(bool)in_stack_fffffffffffffe67)) {
    indent_abi_cxx11_(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
    Printf<std::__cxx11::string,std::__cxx11::string_const&>
              ((char *)in_stack_fffffffffffffea0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe90);
    std::__cxx11::string::~string(local_138);
  }
  else {
    indent_abi_cxx11_(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
    Printf<std::__cxx11::string>
              ((char *)in_stack_fffffffffffffe90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe88);
    std::__cxx11::string::~string(local_118);
  }
  if (((undefined1  [64])((undefined1  [64])in_RDI->field_2 & (undefined1  [64])0x100) !=
       (undefined1  [64])0x0) &&
     (uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffe67,
                                       CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)
                                      ),in_stack_fffffffffffffe58), (bool)uVar1)) {
    name_00 = (string *)&stack0xfffffffffffffea7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98,
               (allocator<char> *)in_stack_fffffffffffffe90);
    ParameterDictionary::RemoveBool
              ((ParameterDictionary *)
               CONCAT17(in_stack_fffffffffffffe67,CONCAT16(uVar1,in_stack_fffffffffffffe60)),name_00
              );
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffea7);
  }
  ParameterDictionary::ToParameterList_abi_cxx11_
            (in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
  std::operator<<((ostream *)&std::cout,local_180);
  std::__cxx11::string::~string(local_180);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x4fde77);
  return;
}

Assistant:

void FormattingParserTarget::Camera(const std::string &name, ParsedParameterVector params,
                                    FileLoc loc) {
    ParameterDictionary dict(std::move(params), RGBColorSpace::sRGB);

    if (upgrade && name == "environment")
        Printf("%sCamera \"spherical\" \"string mapping\" \"equirectangular\"\n",
               indent());
    else
        Printf("%sCamera \"%s\"\n", indent(), name);
    if (upgrade && name == "realistic")
        dict.RemoveBool("simpleweighting");

    std::cout << dict.ToParameterList(catIndentCount);
}